

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O3

CURLcode tftp_multi_statemach(connectdata *conn,_Bool *done)

{
  ulong uVar1;
  Curl_easy *pCVar2;
  tftp_state_data_t *state;
  socklen_t sVar3;
  CURLcode CVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  char *pcVar8;
  ssize_t sVar9;
  void *pvVar10;
  long lVar11;
  tftp_event_t tVar12;
  size_t sVar13;
  undefined8 uVar14;
  size_t sVar15;
  ushort *puVar16;
  ulong __n;
  tftp_state_data_t *state_00;
  ulong uVar17;
  bool bVar18;
  Curl_sockaddr_storage fromaddr;
  socklen_t local_dc;
  char *local_d8;
  tftp_state_data_t *local_d0;
  _Bool *local_c8;
  long local_c0;
  ushort *local_b8;
  sockaddr local_b0 [8];
  
  pCVar2 = conn->data;
  state = (conn->proto).tftpc;
  time((time_t *)local_b0);
  lVar11 = state->max_time;
  if (lVar11 < (long)local_b0[0]._0_8_) {
    state->error = TFTP_ERR_TIMEOUT;
    state->state = TFTP_STATE_FIN;
    *done = false;
  }
  else if ((long)state->retry_time + state->rx_time < (long)local_b0[0]._0_8_) {
    time(&state->rx_time);
    lVar11 = state->max_time;
    *done = false;
    if ((long)local_b0[0]._0_8_ < lVar11) {
      tVar12 = TFTP_EVENT_TIMEOUT;
LAB_00131104:
      CVar4 = tftp_state_machine(state,tVar12);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      bVar18 = state->state == TFTP_STATE_FIN;
      *done = bVar18;
      if (!bVar18) {
        return CURLE_OK;
      }
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
      return CURLE_OK;
    }
  }
  else {
    *done = false;
    if ((long)local_b0[0]._0_8_ < lVar11) {
      iVar5 = Curl_socket_check(state->sockfd,-1,-1,0);
      if (iVar5 == 0) {
        return CURLE_OK;
      }
      if (iVar5 == -1) {
        piVar7 = __errno_location();
        pcVar8 = Curl_strerror(conn,*piVar7);
        Curl_failf(pCVar2,"%s",pcVar8);
        state->event = TFTP_EVENT_ERROR;
        return CURLE_OK;
      }
      pCVar2 = conn->data;
      state_00 = (conn->proto).tftpc;
      local_dc = 0x80;
      sVar9 = recvfrom(state_00->sockfd,(state_00->rpacket).data,(long)state_00->blksize + 4,0,
                       local_b0,&local_dc);
      sVar3 = local_dc;
      uVar6 = (uint)sVar9;
      state_00->rbytes = uVar6;
      if (state_00->remote_addrlen == 0) {
        memcpy(&state_00->remote_addr,local_b0,(ulong)local_dc);
        state_00->remote_addrlen = sVar3;
        uVar6 = state_00->rbytes;
      }
      if ((int)uVar6 < 4) {
        Curl_failf(pCVar2,"Received too short packet");
        state_00->event = TFTP_EVENT_TIMEOUT;
      }
      else {
        puVar16 = (ushort *)(state_00->rpacket).data;
        tVar12 = (tftp_event_t)(ushort)(*puVar16 << 8 | *puVar16 >> 8);
        state_00->event = tVar12;
        switch(tVar12) {
        case TFTP_EVENT_DATA:
          if ((uVar6 != 4) &&
             ((ushort)((short)*(undefined4 *)&state_00->block + 1U) ==
              (ushort)(puVar16[1] << 8 | puVar16[1] >> 8))) {
            CVar4 = Curl_client_write(conn,1,(char *)(puVar16 + 2),(ulong)(uVar6 - 4));
            if (CVar4 != CURLE_OK) {
              tftp_state_machine(state_00,TFTP_EVENT_ERROR);
              return CVar4;
            }
            lVar11 = (long)state_00->rbytes + (pCVar2->req).bytecount + -4;
            (pCVar2->req).bytecount = lVar11;
            Curl_pgrsSetDownloadCounter(pCVar2,lVar11);
          }
          break;
        case TFTP_EVENT_ACK:
          break;
        case TFTP_EVENT_ERROR:
          state_00->error = (uint)(ushort)(puVar16[1] << 8 | puVar16[1] >> 8);
          Curl_infof(pCVar2,"%s\n",puVar16 + 2);
          break;
        case TFTP_EVENT_OACK:
          pCVar2 = state_00->conn->data;
          state_00->blksize = 0x200;
          local_b8 = (ushort *)((long)puVar16 + (ulong)uVar6);
          puVar16 = puVar16 + 1;
          local_d0 = state_00;
          local_c8 = done;
          do {
            __n = (long)local_b8 - (long)puVar16;
            pvVar10 = memchr(puVar16,0,__n);
            uVar17 = (long)pvVar10 - (long)puVar16;
            if (pvVar10 == (void *)0x0) {
              uVar17 = __n;
            }
            uVar1 = uVar17 + 1;
            sVar15 = __n - uVar1;
            if (__n < uVar1 || sVar15 == 0) {
LAB_00131564:
              pcVar8 = "Malformed ACK packet, rejecting";
LAB_00131574:
              Curl_failf(pCVar2,pcVar8);
              return CURLE_TFTP_ILLEGAL;
            }
            pvVar10 = memchr((void *)(uVar1 + (long)puVar16),0,sVar15);
            sVar13 = (long)pvVar10 - (long)(uVar1 + (long)puVar16);
            if (pvVar10 == (void *)0x0) {
              sVar13 = sVar15;
            }
            uVar17 = uVar17 + sVar13 + 2;
            if (__n < uVar17) goto LAB_00131564;
            sVar15 = strlen((char *)puVar16);
            pcVar8 = (char *)((long)puVar16 + sVar15 + 1);
            Curl_infof(pCVar2,"got option=(%s) value=(%s)\n",puVar16);
            sVar15 = strlen((char *)puVar16);
            iVar5 = curl_strnequal((char *)puVar16,"blksize",sVar15);
            if (iVar5 == 0) {
              local_d8 = pcVar8;
              sVar15 = strlen((char *)puVar16);
              iVar5 = curl_strnequal((char *)puVar16,"tsize",sVar15);
              done = local_c8;
              state_00 = local_d0;
              if (iVar5 != 0) {
                local_c0 = strtol(local_d8,(char **)0x0,10);
                Curl_infof(pCVar2,"%s (%ld)\n","tsize parsed from OACK");
                if ((pCVar2->set).upload == false) {
                  if (local_c0 == 0) {
                    Curl_failf(pCVar2,"invalid tsize -:%s:- value in OACK packet",local_d8);
                    return CURLE_TFTP_ILLEGAL;
                  }
                  Curl_pgrsSetDownloadSize(pCVar2,local_c0);
                }
              }
            }
            else {
              lVar11 = strtol(pcVar8,(char **)0x0,10);
              done = local_c8;
              state_00 = local_d0;
              if (lVar11 == 0) {
                pcVar8 = "invalid blocksize value in OACK packet";
                goto LAB_00131574;
              }
              if (0xffb8 < lVar11) {
                pcVar8 = "blksize is larger than max supported";
                uVar14 = 0xffb8;
LAB_001315b4:
                Curl_failf(pCVar2,"%s (%d)",pcVar8,uVar14);
                return CURLE_TFTP_ILLEGAL;
              }
              if (lVar11 < 8) {
                pcVar8 = "blksize is smaller than min supported";
                uVar14 = 8;
                goto LAB_001315b4;
              }
              if (local_d0->requested_blksize < lVar11) {
                Curl_failf(pCVar2,"%s (%ld)","server requested blksize larger than allocated",lVar11
                          );
                return CURLE_TFTP_ILLEGAL;
              }
              local_d0->blksize = (int)lVar11;
              Curl_infof(pCVar2,"%s (%d) %s (%d)\n","blksize parsed from OACK");
            }
            puVar16 = (ushort *)((long)puVar16 + uVar17);
          } while (puVar16 < local_b8);
          break;
        default:
          Curl_failf(pCVar2,"%s","Internal error: Unexpected packet");
        }
        iVar5 = Curl_pgrsUpdate(conn);
        if (iVar5 != 0) {
          tftp_state_machine(state_00,TFTP_EVENT_ERROR);
          return CURLE_ABORTED_BY_CALLBACK;
        }
      }
      tVar12 = state->event;
      goto LAB_00131104;
    }
  }
  Curl_failf(pCVar2,"TFTP response timeout");
  return CURLE_OPERATION_TIMEDOUT;
}

Assistant:

static CURLcode tftp_multi_statemach(struct connectdata *conn, bool *done)
{
  int                   rc;
  tftp_event_t          event;
  CURLcode              result = CURLE_OK;
  struct Curl_easy  *data = conn->data;
  tftp_state_data_t     *state = (tftp_state_data_t *)conn->proto.tftpc;
  long                  timeout_ms = tftp_state_timeout(conn, &event);

  *done = FALSE;

  if(timeout_ms <= 0) {
    failf(data, "TFTP response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  else if(event != TFTP_EVENT_NONE) {
    result = tftp_state_machine(state, event);
    if(result)
      return result;
    *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
    if(*done)
      /* Tell curl we're done */
      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);
  }
  else {
    /* no timeouts to handle, check our socket */
    rc = SOCKET_READABLE(state->sockfd, 0);

    if(rc == -1) {
      /* bail out */
      int error = SOCKERRNO;
      failf(data, "%s", Curl_strerror(conn, error));
      state->event = TFTP_EVENT_ERROR;
    }
    else if(rc != 0) {
      result = tftp_receive_packet(conn);
      if(result)
        return result;
      result = tftp_state_machine(state, state->event);
      if(result)
        return result;
      *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
      if(*done)
        /* Tell curl we're done */
        Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);
    }
    /* if rc == 0, then select() timed out */
  }

  return result;
}